

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomPoints>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,GeomPoints *points
               ,string *warn,string *err,PrimReconstructOptions *options)

{
  bool bVar1;
  uint uVar2;
  string *psVar3;
  size_type sVar4;
  Property *pPVar5;
  mapped_type *this;
  ostream *poVar6;
  undefined4 in_stack_ffffffffffffee6c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1120 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1100 [32];
  string local_10e0 [32];
  ostringstream local_10c0 [8];
  ostringstream ss_e_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f38 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f18 [39];
  allocator local_ef1;
  string local_ef0 [32];
  string local_ed0;
  ostringstream local_eb0 [8];
  ostringstream ss_e_5;
  allocator local_d31;
  undefined1 local_d30 [32];
  undefined1 local_d10 [40];
  ParseResult ret_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca8 [39];
  allocator local_c81;
  string local_c80 [32];
  string local_c60;
  ostringstream local_c40 [8];
  ostringstream ss_e_4;
  allocator local_ac1;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [40];
  ParseResult ret_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a38 [39];
  allocator local_a11;
  string local_a10 [32];
  string local_9f0;
  ostringstream local_9d0 [8];
  ostringstream ss_e_3;
  allocator local_851;
  undefined1 local_850 [32];
  undefined1 local_830 [32];
  undefined1 local_810 [8];
  ParseResult ret_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8 [39];
  allocator local_7a1;
  string local_7a0 [32];
  string local_780;
  ostringstream local_760 [8];
  ostringstream ss_e_2;
  allocator local_5e1;
  string local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  ParseResult ret_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558 [39];
  allocator local_531;
  string local_530 [32];
  string local_510;
  ostringstream local_4f0 [8];
  ostringstream ss_e_1;
  allocator local_371;
  undefined1 local_370 [32];
  undefined1 local_350 [32];
  undefined1 local_330 [8];
  ParseResult ret_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [32];
  string local_2a0;
  ostringstream local_280 [8];
  ostringstream ss_e;
  allocator local_101;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [8];
  ParseResult ret;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
  *prop;
  const_iterator __end2;
  const_iterator __begin2;
  PropertyMap *__range2;
  undefined1 local_70 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  string *err_local;
  string *warn_local;
  GeomPoints *points_local;
  ReferenceList *references_local;
  PropertyMap *properties_local;
  Specifier *spec_local;
  
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)err;
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_70);
  bVar1 = (bool)(options->strict_allowedToken_check & 1);
  uVar2 = (uint)bVar1;
  bVar1 = anon_unknown_0::ReconstructGPrimProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_70,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,&points->super_GPrim,warn,
                     (string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,bVar1);
  if (bVar1) {
    __end2 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
             ::begin(properties);
    prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
            *)::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::end(properties);
    while (bVar1 = ::std::operator!=(&__end2,(_Self *)&prop), bVar1) {
      ret.err.field_2._8_8_ =
           ::std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
           ::operator*(&__end2);
      ::std::__cxx11::string::string((string *)local_e0,(string *)ret.err.field_2._8_8_);
      psVar3 = (string *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_100,"points",&local_101);
      pPVar5 = (Property *)local_100;
      (anonymous_namespace)::
      ParseTypedAttribute<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                ((ParseResult *)local_c0,(_anonymous_namespace_ *)local_70,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_e0,psVar3,pPVar5,(string *)&points->points,
                 (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffee6c,uVar2));
      ::std::__cxx11::string::~string((string *)local_100);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_101);
      ::std::__cxx11::string::~string((string *)local_e0);
      if ((local_c0._0_4_ == Success) || (local_c0._0_4_ == AlreadyProcessed)) {
        __range2._4_4_ = 3;
      }
      else if (local_c0._0_4_ == Unmatched) {
        __range2._4_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_280);
        poVar6 = ::std::operator<<((ostream *)local_280,"[error]");
        poVar6 = ::std::operator<<(poVar6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar6 = ::std::operator<<(poVar6,":");
        poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
        poVar6 = ::std::operator<<(poVar6,"():");
        poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xd88);
        ::std::operator<<(poVar6," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_2c0,"Parsing attribute `{}` failed. Error: {}",&local_2c1);
        fmt::format<char[7],std::__cxx11::string>
                  (&local_2a0,(fmt *)local_2c0,(string *)"points",(char (*) [7])&ret,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar5);
        poVar6 = ::std::operator<<((ostream *)local_280,(string *)&local_2a0);
        ::std::operator<<(poVar6,"\n");
        ::std::__cxx11::string::~string((string *)&local_2a0);
        ::std::__cxx11::string::~string(local_2c0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_2e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_1.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_2e8);
          ::std::__cxx11::string::~string((string *)local_2e8);
          ::std::__cxx11::string::~string((string *)(ret_1.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        __range2._4_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_280);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_c0);
      if (__range2._4_4_ == 0) {
        ::std::__cxx11::string::string((string *)local_350,(string *)ret.err.field_2._8_8_);
        psVar3 = (string *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_370,"normals",&local_371);
        pPVar5 = (Property *)local_370;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                  ((ParseResult *)local_330,(_anonymous_namespace_ *)local_70,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_350,psVar3,pPVar5,(string *)&points->normals,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffee6c,uVar2));
        ::std::__cxx11::string::~string((string *)local_370);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_371);
        ::std::__cxx11::string::~string((string *)local_350);
        if ((local_330._0_4_ == Success) || (local_330._0_4_ == AlreadyProcessed)) {
          __range2._4_4_ = 3;
        }
        else if (local_330._0_4_ == Unmatched) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_4f0);
          poVar6 = ::std::operator<<((ostream *)local_4f0,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xd89);
          ::std::operator<<(poVar6," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_530,"Parsing attribute `{}` failed. Error: {}",&local_531);
          fmt::format<char[8],std::__cxx11::string>
                    (&local_510,(fmt *)local_530,(string *)"normals",(char (*) [8])&ret_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar5);
          poVar6 = ::std::operator<<((ostream *)local_4f0,(string *)&local_510);
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::string::~string((string *)&local_510);
          ::std::__cxx11::string::~string(local_530);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_531);
          if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_558,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_2.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=
                      ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)local_558);
            ::std::__cxx11::string::~string((string *)local_558);
            ::std::__cxx11::string::~string((string *)(ret_2.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_4f0);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_330);
        if (__range2._4_4_ != 0) goto joined_r0x002be40e;
        ::std::__cxx11::string::string((string *)local_5c0,(string *)ret.err.field_2._8_8_);
        psVar3 = (string *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_5e0,"widths",&local_5e1);
        pPVar5 = (Property *)local_5e0;
        (anonymous_namespace)::ParseTypedAttribute<std::vector<float,std::allocator<float>>>
                  ((ParseResult *)local_5a0,(_anonymous_namespace_ *)local_70,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_5c0,psVar3,pPVar5,(string *)&points->widths,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffee6c,uVar2));
        ::std::__cxx11::string::~string(local_5e0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
        ::std::__cxx11::string::~string((string *)local_5c0);
        if ((local_5a0._0_4_ == Success) || (local_5a0._0_4_ == AlreadyProcessed)) {
          __range2._4_4_ = 3;
        }
        else if (local_5a0._0_4_ == Unmatched) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_760);
          poVar6 = ::std::operator<<((ostream *)local_760,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xd8a);
          ::std::operator<<(poVar6," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_7a0,"Parsing attribute `{}` failed. Error: {}",&local_7a1);
          fmt::format<char[7],std::__cxx11::string>
                    (&local_780,(fmt *)local_7a0,(string *)"widths",(char (*) [7])&ret_2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar5);
          poVar6 = ::std::operator<<((ostream *)local_760,(string *)&local_780);
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::string::~string((string *)&local_780);
          ::std::__cxx11::string::~string(local_7a0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
          if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_7c8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_3.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=
                      ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)local_7c8);
            ::std::__cxx11::string::~string((string *)local_7c8);
            ::std::__cxx11::string::~string((string *)(ret_3.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_760);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_5a0);
        if (__range2._4_4_ != 0) goto joined_r0x002be40e;
        ::std::__cxx11::string::string((string *)local_830,(string *)ret.err.field_2._8_8_);
        psVar3 = (string *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_850,"ids",&local_851);
        pPVar5 = (Property *)local_850;
        (anonymous_namespace)::ParseTypedAttribute<std::vector<long,std::allocator<long>>>
                  ((ParseResult *)local_810,(_anonymous_namespace_ *)local_70,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_830,psVar3,pPVar5,(string *)&points->ids,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<long,_std::allocator<long>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffee6c,uVar2));
        ::std::__cxx11::string::~string((string *)local_850);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_851);
        ::std::__cxx11::string::~string((string *)local_830);
        if ((local_810._0_4_ == Success) || (local_810._0_4_ == AlreadyProcessed)) {
          __range2._4_4_ = 3;
        }
        else if (local_810._0_4_ == Unmatched) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_9d0);
          poVar6 = ::std::operator<<((ostream *)local_9d0,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xd8b);
          ::std::operator<<(poVar6," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_a10,"Parsing attribute `{}` failed. Error: {}",&local_a11);
          fmt::format<char[4],std::__cxx11::string>
                    (&local_9f0,(fmt *)local_a10,(string *)"ids",(char (*) [4])&ret_3,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar5);
          poVar6 = ::std::operator<<((ostream *)local_9d0,(string *)&local_9f0);
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::string::~string((string *)&local_9f0);
          ::std::__cxx11::string::~string(local_a10);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_a11);
          if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_a38,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_4.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=
                      ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)local_a38);
            ::std::__cxx11::string::~string((string *)local_a38);
            ::std::__cxx11::string::~string((string *)(ret_4.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_9d0);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_810);
        if (__range2._4_4_ != 0) goto joined_r0x002be40e;
        ::std::__cxx11::string::string((string *)local_aa0,(string *)ret.err.field_2._8_8_);
        psVar3 = (string *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_ac0,"velocities",&local_ac1);
        pPVar5 = (Property *)local_ac0;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                  ((ParseResult *)(local_aa0 + 0x20),(_anonymous_namespace_ *)local_70,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_aa0,psVar3,pPVar5,(string *)&points->velocities,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffee6c,uVar2));
        ::std::__cxx11::string::~string((string *)local_ac0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_ac1);
        ::std::__cxx11::string::~string((string *)local_aa0);
        if ((local_aa0._32_4_ == 0) || (local_aa0._32_4_ == 2)) {
          __range2._4_4_ = 3;
        }
        else if (local_aa0._32_4_ == 1) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_c40);
          poVar6 = ::std::operator<<((ostream *)local_c40,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xd8c);
          ::std::operator<<(poVar6," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_c80,"Parsing attribute `{}` failed. Error: {}",&local_c81);
          fmt::format<char[11],std::__cxx11::string>
                    (&local_c60,(fmt *)local_c80,(string *)"velocities",(char (*) [11])&ret_4,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar5);
          poVar6 = ::std::operator<<((ostream *)local_c40,(string *)&local_c60);
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::string::~string((string *)&local_c60);
          ::std::__cxx11::string::~string(local_c80);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_c81);
          if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_ca8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_5.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=
                      ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)local_ca8);
            ::std::__cxx11::string::~string((string *)local_ca8);
            ::std::__cxx11::string::~string((string *)(ret_5.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_c40);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)(local_aa0 + 0x20));
        if (__range2._4_4_ != 0) goto joined_r0x002be40e;
        ::std::__cxx11::string::string((string *)local_d10,(string *)ret.err.field_2._8_8_);
        psVar3 = (string *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_d30,"accelerations",&local_d31);
        pPVar5 = (Property *)local_d30;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                  ((ParseResult *)(local_d10 + 0x20),(_anonymous_namespace_ *)local_70,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_d10,psVar3,pPVar5,(string *)&points->accelerations,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffee6c,uVar2));
        ::std::__cxx11::string::~string((string *)local_d30);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_d31);
        ::std::__cxx11::string::~string((string *)local_d10);
        if ((local_d10._32_4_ == 0) || (local_d10._32_4_ == 2)) {
          __range2._4_4_ = 3;
        }
        else if (local_d10._32_4_ == 1) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_eb0);
          poVar6 = ::std::operator<<((ostream *)local_eb0,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xd8d);
          ::std::operator<<(poVar6," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_ef0,"Parsing attribute `{}` failed. Error: {}",&local_ef1);
          fmt::format<char[14],std::__cxx11::string>
                    (&local_ed0,(fmt *)local_ef0,(string *)"accelerations",(char (*) [14])&ret_5,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar5);
          poVar6 = ::std::operator<<((ostream *)local_eb0,(string *)&local_ed0);
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::string::~string((string *)&local_ed0);
          ::std::__cxx11::string::~string(local_ef0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_ef1);
          if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_f18,local_f38);
            ::std::__cxx11::string::operator=
                      ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)local_f18);
            ::std::__cxx11::string::~string((string *)local_f18);
            ::std::__cxx11::string::~string((string *)local_f38);
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_eb0);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)(local_d10 + 0x20));
        if (__range2._4_4_ != 0) goto joined_r0x002be40e;
        sVar4 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_70,(key_type *)ret.err.field_2._8_8_);
        if (sVar4 == 0) {
          pPVar5 = (Property *)(ret.err.field_2._8_8_ + 0x20);
          this = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                 ::operator[](&(points->super_GPrim).props,(key_type *)ret.err.field_2._8_8_);
          Property::operator=(this,pPVar5);
          ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_70,(value_type *)ret.err.field_2._8_8_);
        }
        sVar4 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_70,(key_type *)ret.err.field_2._8_8_);
        if (sVar4 == 0) {
          ::std::__cxx11::ostringstream::ostringstream(local_10c0);
          poVar6 = ::std::operator<<((ostream *)local_10c0,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xd8f);
          ::std::operator<<(poVar6," ");
          ::std::operator+((char *)local_10e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "Unsupported/unimplemented property: ");
          poVar6 = ::std::operator<<((ostream *)local_10c0,local_10e0);
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::string::~string(local_10e0);
          if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_1100,local_1120);
            ::std::__cxx11::string::operator=
                      ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)local_1100);
            ::std::__cxx11::string::~string((string *)local_1100);
            ::std::__cxx11::string::~string((string *)local_1120);
          }
          spec_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_10c0);
          goto LAB_002beaea;
        }
      }
      else {
joined_r0x002be40e:
        if (__range2._4_4_ != 3) goto LAB_002beaea;
      }
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
      ::operator++(&__end2);
    }
    spec_local._7_1_ = 1;
  }
  else {
    spec_local._7_1_ = 0;
  }
LAB_002beaea:
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_70);
  return (bool)(spec_local._7_1_ & 1);
}

Assistant:

bool ReconstructPrim<GeomPoints>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomPoints *points,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)warn;
  (void)references;
  (void)options;

  DCOUT("Reconstruct Points.");

  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, points, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    DCOUT("prop: " << prop.first);
    PARSE_TYPED_ATTRIBUTE(table, prop, "points", GeomPoints, points->points)
    PARSE_TYPED_ATTRIBUTE(table, prop, "normals", GeomPoints, points->normals)
    PARSE_TYPED_ATTRIBUTE(table, prop, "widths", GeomPoints, points->widths)
    PARSE_TYPED_ATTRIBUTE(table, prop, "ids", GeomPoints, points->ids)
    PARSE_TYPED_ATTRIBUTE(table, prop, "velocities", GeomPoints, points->velocities)
    PARSE_TYPED_ATTRIBUTE(table, prop, "accelerations", GeomPoints, points->accelerations)
    ADD_PROPERTY(table, prop, GeomSphere, points->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

  return true;
}